

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void __thiscall
duckdb::BinaryExecutor::
ExecuteConstant<duckdb::interval_t,duckdb::dtime_t,duckdb::dtime_t,duckdb::BinaryStandardOperatorWrapper,duckdb::AddTimeOperator,bool>
          (BinaryExecutor *this,Vector *left,Vector *right,Vector *result,bool fun)

{
  int64_t *piVar1;
  unsigned_long *puVar2;
  dtime_t dVar3;
  undefined7 in_register_00000081;
  interval_t right_00;
  date_t date;
  undefined4 local_1c;
  
  Vector::SetVectorType(right,CONSTANT_VECTOR);
  piVar1 = (int64_t *)right->data;
  if (((*(byte **)(this + 0x28) == (byte *)0x0) || ((**(byte **)(this + 0x28) & 1) != 0)) &&
     ((puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
      puVar2 == (unsigned_long *)0x0 || ((*puVar2 & 1) != 0)))) {
    local_1c = 0;
    right_00.micros = (int64_t)&local_1c;
    right_00._0_8_ = (*(int64_t **)(this + 0x20))[1];
    dVar3 = Interval::Add(*(Interval **)left->data,**(int64_t **)(this + 0x20),right_00,
                          (date_t *)CONCAT71(in_register_00000081,fun));
    *piVar1 = dVar3.micros;
    return;
  }
  ConstantVector::SetNull(right,true);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}